

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

uint32_t array_container_rank_many
                   (array_container_t *arr,uint64_t start_rank,uint32_t *begin,uint32_t *end,
                   uint64_t *ans)

{
  ushort uVar1;
  uint uVar2;
  uint32_t *puVar3;
  uint32_t *puVar4;
  uint32_t *iter;
  ushort uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint64_t uVar10;
  uint uVar11;
  int iVar12;
  
  puVar4 = begin;
  if (begin != end) {
    uVar2 = *begin;
    uVar8 = 0;
    puVar3 = begin;
    do {
      puVar4 = puVar3;
      if (0xffff < (*puVar3 ^ uVar2)) break;
      uVar9 = (ulong)uVar8;
      iVar12 = arr->cardinality - uVar8;
      if (iVar12 < 1) {
        uVar6 = 0;
      }
      else {
        iVar12 = iVar12 + -1;
        uVar6 = 0;
        do {
          uVar11 = iVar12 + (int)uVar6;
          uVar7 = uVar11 >> 1;
          uVar1 = *(ushort *)((long)arr->array + (ulong)(uVar11 & 0xfffffffe) + uVar9 * 2);
          uVar5 = (ushort)*puVar3;
          if (uVar1 < uVar5) {
            uVar6 = (ulong)(uVar7 + 1);
          }
          else {
            if (uVar1 <= uVar5) {
              uVar8 = uVar7 + 1;
              uVar10 = uVar9 + start_rank + (ulong)uVar7 + 1;
              goto LAB_00112d11;
            }
            iVar12 = uVar7 - 1;
          }
        } while ((int)uVar6 <= iVar12);
      }
      uVar10 = uVar9 + start_rank + uVar6;
LAB_00112d11:
      *ans = uVar10;
      ans = ans + 1;
      puVar3 = puVar3 + 1;
      puVar4 = end;
    } while (puVar3 != end);
  }
  return (uint32_t)((ulong)((long)puVar4 - (long)begin) >> 2);
}

Assistant:

inline uint32_t array_container_rank_many(const array_container_t *arr,
                                          uint64_t start_rank,
                                          const uint32_t *begin,
                                          const uint32_t *end, uint64_t *ans) {
    const uint16_t high = (uint16_t)((*begin) >> 16);
    uint32_t pos = 0;
    const uint32_t *iter = begin;
    for (; iter != end; iter++) {
        uint32_t x = *iter;
        uint16_t xhigh = (uint16_t)(x >> 16);
        if (xhigh != high) return iter - begin;  // stop at next container

        const int32_t idx =
            binarySearch(arr->array + pos, arr->cardinality - pos, (uint16_t)x);
        const bool is_present = idx >= 0;
        if (is_present) {
            *(ans++) = start_rank + pos + (idx + 1);
            pos = idx + 1;
        } else {
            *(ans++) = start_rank + pos + (-idx - 1);
        }
    }
    return iter - begin;
}